

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::ext_certificate_authorities_add_clienthello
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type)

{
  bool bVar1;
  int iVar2;
  CBB ca_contents;
  CBB local_40;
  
  bVar1 = ssl_has_CA_names(hs->config);
  if (bVar1) {
    iVar2 = CBB_add_u16(out_compressible,0x2f);
    if (iVar2 != 0) {
      iVar2 = CBB_add_u16_length_prefixed(out_compressible,&local_40);
      if (iVar2 != 0) {
        bVar1 = ssl_add_CA_names(hs,&local_40);
        if (bVar1) {
          iVar2 = CBB_flush(out_compressible);
          if (iVar2 != 0) goto LAB_0013f185;
        }
      }
    }
    bVar1 = false;
  }
  else {
LAB_0013f185:
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

static bool ext_certificate_authorities_add_clienthello(
    const SSL_HANDSHAKE *hs, CBB *out, CBB *out_compressible,
    ssl_client_hello_type_t type) {
  // TODO(crbug.com/398275713): What should this send in ClientHelloOuter?
  if (ssl_has_CA_names(hs->config)) {
    CBB ca_contents;
    if (!CBB_add_u16(out_compressible,
                     TLSEXT_TYPE_certificate_authorities) ||  //
        !CBB_add_u16_length_prefixed(out_compressible, &ca_contents) ||    //
        !ssl_add_CA_names(hs, &ca_contents) ||                //
        !CBB_flush(out_compressible)) {
      return false;
    }
  }
  return true;
}